

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

void printHelp(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\x1b[93mUsage: \x1b[0m[<Options>] <number_of_puzzles>:\n");
  poVar1 = std::operator<<(poVar1,"\tProgram options are: \n");
  poVar1 = std::operator<<(poVar1,
                           "\t\t\x1b[96m--rows <num>\t\x1b[0mSpecify the number of rows for the matrix, with \'<num>\' in the range [\x1b[32m7 \x1b[0m,\x1b[32m16 \x1b[0m]. The default value is 10.\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "\t\t\x1b[96m--cols <num>\t\x1b[0mSpecify the number of columns for the matrix, with \'<num>\' in the range [\x1b[32m7 \x1b[0m,\x1b[32m16 \x1b[0m]. The default value is 10.\n"
                          );
  poVar1 = std::operator<<(poVar1,"\tRequested input: \n");
  std::operator<<(poVar1,
                  "\t\t<number_of_puzzles> the number of puzzles to be generated, in the range [1, 100].\n"
                 );
  return;
}

Assistant:

void printHelp()
{
       std::cout << "\x1b[93mUsage: \x1b[0m[<Options>] <number_of_puzzles>:\n"
                  << "\tProgram options are: \n" 
                  << "\t\t\x1b[96m--rows <num>	\x1b[0mSpecify the number of rows for the matrix, with '<num>' in the range [\x1b[32m7 \x1b[0m,\x1b[32m16 \x1b[0m]. The default value is 10.\n"
                  << "\t\t\x1b[96m--cols <num>	\x1b[0mSpecify the number of columns for the matrix, with '<num>' in the range [\x1b[32m7 \x1b[0m,\x1b[32m16 \x1b[0m]. The default value is 10.\n"
                  << "\tRequested input: \n"
                  << "\t\t<number_of_puzzles> the number of puzzles to be generated, in the range [1, 100].\n";
}